

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O0

int gen_holiday_fl(char *dest,int month,int day)

{
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (9 < local_1c) {
      strcpy(in_RDI,"0");
      return 0;
    }
    if ((holidays[local_1c].month == in_ESI) && (holidays[local_1c].day == in_EDX)) break;
    local_1c = local_1c + 1;
  }
  strcpy(in_RDI,"1");
  return 0;
}

Assistant:

int gen_holiday_fl(char * dest, int month, int day){
  int i;
  for(i = 0; i< NUM_HOLIDAYS; i++){
    if(holidays[i].month == month && holidays[i].day == day){
      strcpy(dest,"1");
      return 0;
    }
  }
  strcpy(dest,"0");
  return 0;
}